

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

void compute_accelerated_huffman(Codebook *c)

{
  long in_RDI;
  uint32 z;
  int len;
  int i;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 0x400; local_c = local_c + 1) {
    *(undefined2 *)(in_RDI + 0x30 + (long)local_c * 2) = 0xffff;
  }
  if (*(char *)(in_RDI + 0x1b) == '\0') {
    local_18 = *(int *)(in_RDI + 4);
  }
  else {
    local_18 = *(int *)(in_RDI + 0x840);
  }
  local_10 = local_18;
  if (0x7fff < local_18) {
    local_10 = 0x7fff;
  }
  for (local_c = 0; local_c < local_10; local_c = local_c + 1) {
    if (*(byte *)(*(long *)(in_RDI + 8) + (long)local_c) < 0xb) {
      if (*(char *)(in_RDI + 0x1b) == '\0') {
        local_1c = *(uint *)(*(long *)(in_RDI + 0x28) + (long)local_c * 4);
      }
      else {
        local_1c = bit_reverse(*(uint *)(*(long *)(in_RDI + 0x830) + (long)local_c * 4));
      }
      for (local_14 = local_1c; local_14 < 0x400;
          local_14 = (1 << (*(byte *)(*(long *)(in_RDI + 8) + (long)local_c) & 0x1f)) + local_14) {
        *(short *)(in_RDI + 0x30 + (ulong)local_14 * 2) = (short)local_c;
      }
    }
  }
  return;
}

Assistant:

static void compute_accelerated_huffman(Codebook *c)
{
   int i, len;
   for (i=0; i < FAST_HUFFMAN_TABLE_SIZE; ++i)
      c->fast_huffman[i] = -1;

   len = c->sparse ? c->sorted_entries : c->entries;
   #ifdef STB_VORBIS_FAST_HUFFMAN_SHORT
   if (len > 32767) len = 32767; // largest possible value we can encode!
   #endif
   for (i=0; i < len; ++i) {
      if (c->codeword_lengths[i] <= STB_VORBIS_FAST_HUFFMAN_LENGTH) {
         uint32 z = c->sparse ? bit_reverse(c->sorted_codewords[i]) : c->codewords[i];
         // set table entries for all bit combinations in the higher bits
         while (z < FAST_HUFFMAN_TABLE_SIZE) {
             c->fast_huffman[z] = i;
             z += 1 << c->codeword_lengths[i];
         }
      }
   }
}